

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O2

void startElementDebug(void *ctx,xmlChar *name,xmlChar **atts)

{
  xmlChar **ppxVar1;
  xmllintState *lint;
  
  *(int *)((long)ctx + 0x24) = *(int *)((long)ctx + 0x24) + 1;
  if (*(int *)((long)ctx + 0x34) != 0) {
    return;
  }
  fprintf(_stdout,"SAX.startElement(%s",name);
  if (atts != (xmlChar **)0x0) {
    for (ppxVar1 = atts + 1; ppxVar1[-1] != (xmlChar *)0x0; ppxVar1 = ppxVar1 + 2) {
      fprintf(_stdout,", %s=\'");
      if (*ppxVar1 != (xmlChar *)0x0) {
        fprintf(_stdout,"%s\'");
      }
    }
  }
  fwrite(")\n",2,1,_stdout);
  return;
}

Assistant:

static void
startElementDebug(void *ctx, const xmlChar *name, const xmlChar **atts)
{
    xmllintState *lint = ctx;
    int i;

    lint->callbacks++;
    if (lint->noout)
	return;
    fprintf(stdout, "SAX.startElement(%s", (char *) name);
    if (atts != NULL) {
        for (i = 0;(atts[i] != NULL);i++) {
	    fprintf(stdout, ", %s='", atts[i++]);
	    if (atts[i] != NULL)
	        fprintf(stdout, "%s'", atts[i]);
	}
    }
    fprintf(stdout, ")\n");
}